

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<float>::UnsafeArenaSwap
          (RepeatedField<float> *this,RepeatedField<float> *other)

{
  Arena **v1;
  Arena **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_48;
  Voidify local_31;
  Arena *local_30;
  Arena *local_28;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  RepeatedField<float> *other_local;
  RepeatedField<float> *this_local;
  
  if (this != other) {
    absl_log_internal_check_op_result = (Nullable<const_char_*>)other;
    other_local = this;
    local_28 = GetArena(this);
    v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Arena*>
                   (&local_28);
    local_30 = GetArena((RepeatedField<float> *)absl_log_internal_check_op_result);
    v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Arena*>
                   (&local_30);
    local_20 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                         (v1,v2,"GetArena() == other->GetArena()");
    if (local_20 != (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x445,failure_msg);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar1);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_48);
    }
    InternalSwap(this,(RepeatedField<float> *)absl_log_internal_check_op_result);
  }
  return;
}

Assistant:

void RepeatedField<Element>::UnsafeArenaSwap(RepeatedField* other) {
  if (this == other) return;
  ABSL_DCHECK_EQ(GetArena(), other->GetArena());
  InternalSwap(other);
}